

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gige_request_counter.cc
# Opt level: O1

tuple<unsigned_char,_unsigned_char> rcdiscover::GigERequestCounter::getNext(void)

{
  __atomic_base<unsigned_long> _Var1;
  undefined2 *in_RDI;
  
  _Var1 = getNext::counter.super___atomic_base<unsigned_long>._M_i + 1;
  if (getNext::counter.super___atomic_base<unsigned_long>._M_i == 0xffff) {
    _Var1._M_i = 1;
  }
  LOCK();
  UNLOCK();
  getNext::counter.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var1._M_i;
  *in_RDI = (short)_Var1._M_i;
  return (tuple<unsigned_char,_unsigned_char>)SUB82(in_RDI,0);
}

Assistant:

std::tuple<std::uint8_t, std::uint8_t> GigERequestCounter::getNext()
{
  static std::atomic_uint_fast16_t counter(0);

  std::uint_fast16_t new_value;
  std::uint_fast16_t current;
  do
  {
    current = counter;
    if (current == std::numeric_limits<std::uint16_t>::max())
    {
      // skip 0
      new_value = 1;
    }
    else
    {
      new_value = static_cast<std::uint_fast16_t>(current + 1);
    }
  }
  while (!counter.compare_exchange_weak(current, new_value));

  return std::make_tuple(static_cast<std::uint8_t>(new_value >> 8),
                         static_cast<std::uint8_t>(new_value));
}